

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::ScaleRatioFromValueT<double,double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  double dVar7;
  
  fVar6 = 0.0;
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    dVar3 = v_max;
    dVar2 = v_min;
    if (v_max <= v_min) {
      dVar3 = v_min;
      dVar2 = v_max;
    }
    if (v <= dVar3) {
      dVar3 = v;
    }
    dVar2 = (double)(~-(ulong)(v < dVar2) & (ulong)dVar3 | (ulong)dVar2 & -(ulong)(v < dVar2));
    if (is_logarithmic) {
      dVar4 = v_min;
      dVar3 = v_max;
      if (v_min <= v_max) {
        dVar4 = v_max;
        dVar3 = v_min;
      }
      dVar5 = (double)logarithmic_zero_epsilon;
      dVar1 = dVar3;
      if (ABS(dVar3) < dVar5) {
        fVar6 = logarithmic_zero_epsilon;
        if (dVar3 < 0.0) {
          fVar6 = -logarithmic_zero_epsilon;
        }
        dVar1 = (double)fVar6;
      }
      dVar7 = dVar4;
      if (ABS(dVar4) < dVar5) {
        fVar6 = logarithmic_zero_epsilon;
        if (dVar4 < 0.0) {
          fVar6 = -logarithmic_zero_epsilon;
        }
        dVar7 = (double)fVar6;
      }
      if ((dVar3 != 0.0) || (0.0 <= dVar4)) {
        if ((dVar4 == 0.0) && (dVar3 < 0.0)) {
          dVar7 = (double)-logarithmic_zero_epsilon;
        }
      }
      else {
        dVar1 = (double)-logarithmic_zero_epsilon;
      }
      fVar6 = 0.0;
      if (dVar1 < dVar2) {
        if (dVar7 <= dVar2) {
          fVar6 = 1.0;
        }
        else if (0.0 <= v_min * v_max) {
          if ((dVar3 < 0.0) || (dVar4 < 0.0)) {
            dVar2 = log(dVar2 / dVar7);
            dVar3 = log(dVar1 / dVar7);
            fVar6 = 1.0 - (float)(dVar2 / dVar3);
          }
          else {
            dVar2 = log(dVar2 / dVar1);
            dVar3 = log(dVar7 / dVar1);
            fVar6 = (float)(dVar2 / dVar3);
          }
        }
        else {
          fVar6 = -(float)dVar3 / ((float)dVar4 - (float)dVar3);
          if ((v != 0.0) || (NAN(v))) {
            if (0.0 <= v) {
              dVar2 = log(dVar2 / dVar5);
              dVar3 = log(dVar7 / dVar5);
              fVar6 = fVar6 + zero_deadzone_halfsize +
                      (1.0 - (fVar6 + zero_deadzone_halfsize)) * (float)(dVar2 / dVar3);
            }
            else {
              dVar2 = log(-dVar2 / dVar5);
              dVar3 = log(-dVar1 / dVar5);
              fVar6 = (fVar6 - zero_deadzone_halfsize) * (1.0 - (float)(dVar2 / dVar3));
            }
          }
        }
      }
      if (v_max < v_min) {
        fVar6 = 1.0 - fVar6;
      }
    }
    else {
      fVar6 = (float)((dVar2 - v_min) / (v_max - v_min));
    }
  }
  return fVar6;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;
        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }
    else
    {
        // Linear slider
        return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
    }
}